

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

int Vec_QuePop(Vec_Que_t *p)

{
  int iVar1;
  int iVar2;
  int Res;
  int v;
  Vec_Que_t *p_local;
  
  if (1 < p->nSize) {
    iVar1 = p->pHeap[1];
    p->pOrder[iVar1] = -1;
    iVar2 = p->nSize + -1;
    p->nSize = iVar2;
    if (iVar2 == 1) {
      p->pHeap[1] = -1;
    }
    else {
      iVar2 = p->pHeap[p->nSize];
      p->pHeap[p->nSize] = -1;
      p->pHeap[1] = iVar2;
      p->pOrder[iVar2] = 1;
      Vec_QueMoveDown(p,iVar2);
    }
    return iVar1;
  }
  __assert_fail("p->nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                ,0xed,"int Vec_QuePop(Vec_Que_t *)");
}

Assistant:

static inline int Vec_QuePop( Vec_Que_t * p )
{
    int v, Res;
    assert( p->nSize > 1 );
    Res = p->pHeap[1];      p->pOrder[Res] = -1;
    if ( --p->nSize == 1 )
    {
        p->pHeap[1] = -1;
        return Res;
    }
    v = p->pHeap[p->nSize]; p->pHeap[p->nSize] = -1;
    p->pHeap[1] = v;        p->pOrder[v] = 1;
    Vec_QueMoveDown( p, v );
    return Res;
}